

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O1

void DivisionHelper<int,_char,_5>::DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
               (int *t,char *u,int *result)

{
  int iVar1;
  
  if (*u != '\0') {
    if (*t == 0) {
      iVar1 = 0;
    }
    else {
      iVar1 = *t / (int)*u;
    }
    *result = iVar1;
    return;
  }
  safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnDivZero();
}

Assistant:

SAFEINT_CONSTEXPR14 static void DivideThrow( const T& t, const U& u, T& result ) SAFEINT_CPP_THROW
    {
        if(u == 0)
        {
            E::SafeIntOnDivZero();
        }

        if( t == 0 )
        {
            result = 0;
            return;
        }

        // Must test for corner case
        if( t == std::numeric_limits<T>::min() && u == (U)-1 )
            E::SafeIntOnOverflow();

        result = (T)( t/u );
    }